

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.h
# Opt level: O0

bool __thiscall BloomFilter<long_long>::find(BloomFilter<long_long> *this,longlong *data)

{
  bool bVar1;
  unsigned_long uVar2;
  bool local_71;
  reference local_68;
  int local_54;
  longlong *local_50;
  ulong local_48;
  unsigned_long h;
  _Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>
  *_hash;
  iterator __end1;
  iterator __begin1;
  vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  *__range1;
  bool result;
  longlong *data_local;
  BloomFilter<long_long> *this_local;
  
  __range1._7_1_ = true;
  __end1 = std::
           vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
           ::begin(&this->_hashes);
  _hash = (_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>
           *)std::
             vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
             ::end(&this->_hashes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_*,_std::vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>_>
                                *)&_hash);
    if (!bVar1) break;
    h = (unsigned_long)
        __gnu_cxx::
        __normal_iterator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_*,_std::vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>_>
        ::operator*(&__end1);
    local_54 = 4;
    local_50 = data;
    uVar2 = std::
            _Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>
            ::operator()((_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>
                          *)h,&local_50,&local_54);
    local_48 = uVar2 % this->_length;
    local_71 = false;
    if (__range1._7_1_ != false) {
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_bits,local_48);
      local_71 = std::_Bit_reference::operator_cast_to_bool(&local_68);
    }
    __range1._7_1_ = local_71;
    __gnu_cxx::
    __normal_iterator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_*,_std::vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

auto BloomFilter<T>::find(const T &data) {
    auto result = true;
    for (auto &_hash : _hashes) {
        auto h = _hash(&data, 4) % _length;
        result = result && _bits[h];
    }
    return result;
}